

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_unpacked.c
# Opt level: O0

int UNPK_seek(PHYSFS_Io *io,PHYSFS_uint64 offset)

{
  long *plVar1;
  int rc;
  UNPKentry *entry;
  UNPKfileinfo *finfo;
  PHYSFS_uint64 offset_local;
  PHYSFS_Io *io_local;
  
  plVar1 = (long *)io->opaque;
  if (offset < *(ulong *)(plVar1[1] + 0x30)) {
    io_local._4_4_ = (**(code **)(*plVar1 + 0x20))(*plVar1,*(long *)(plVar1[1] + 0x28) + offset);
    if (io_local._4_4_ != 0) {
      *(int *)(plVar1 + 2) = (int)offset;
    }
  }
  else {
    PHYSFS_setErrorCode(PHYSFS_ERR_PAST_EOF);
    io_local._4_4_ = 0;
  }
  return io_local._4_4_;
}

Assistant:

static int UNPK_seek(PHYSFS_Io *io, PHYSFS_uint64 offset)
{
    UNPKfileinfo *finfo = (UNPKfileinfo *) io->opaque;
    const UNPKentry *entry = finfo->entry;
    int rc;

    BAIL_IF(offset >= entry->size, PHYSFS_ERR_PAST_EOF, 0);
    rc = finfo->io->seek(finfo->io, entry->startPos + offset);
    if (rc)
        finfo->curPos = (PHYSFS_uint32) offset;

    return rc;
}